

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

void __thiscall UrsaClient::setup_connection(UrsaClient *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  socket_t *psVar1;
  string_view_t fmt;
  anon_class_8_1_8991fb9c make_socket;
  socket_t local_30;
  
  if (this->is_interactive == true) {
    fmt.size_ = (size_t)this;
    fmt.data_ = (char *)0x10;
    spdlog::info<std::__cxx11::string>((spdlog *)"Connecting to {}",fmt,in_RCX);
  }
  setup_connection::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)&local_30);
  psVar1 = &local_30;
  zmq::socket_t::operator=(&this->cmd_socket,&local_30);
  zmq::socket_t::close(&local_30,(int)psVar1);
  check_conn_status(this,&this->cmd_socket);
  setup_connection::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)&local_30);
  psVar1 = &local_30;
  zmq::socket_t::operator=(&this->status_socket,&local_30);
  zmq::socket_t::close(&local_30,(int)psVar1);
  return;
}

Assistant:

void UrsaClient::setup_connection() {
    auto make_socket = [this]() {
        zmq::socket_t socket(context, ZMQ_REQ);
        socket.setsockopt(ZMQ_LINGER, 0);
        socket.setsockopt(ZMQ_RCVTIMEO, 1000);
        socket.connect(server_addr);
        return socket;
    };

    if (is_interactive) {
        spdlog::info("Connecting to {}", server_addr);
    }
    cmd_socket = make_socket();
    check_conn_status(&cmd_socket);
    status_socket = make_socket();
}